

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O1

void __thiscall
slang::SmallVectorBase<slang::ast::EvalContext::Frame>::cleanup
          (SmallVectorBase<slang::ast::EvalContext::Frame> *this,EVP_PKEY_CTX *ctx)

{
  pointer this_00;
  long lVar1;
  
  if (this->len != 0) {
    this_00 = this->data_;
    lVar1 = this->len * 0x50;
    do {
      std::
      _Rb_tree<const_slang::ast::ValueSymbol_*,_std::pair<const_slang::ast::ValueSymbol_*const,_slang::ConstantValue>,_std::_Select1st<std::pair<const_slang::ast::ValueSymbol_*const,_slang::ConstantValue>_>,_std::less<const_slang::ast::ValueSymbol_*>,_std::allocator<std::pair<const_slang::ast::ValueSymbol_*const,_slang::ConstantValue>_>_>
      ::~_Rb_tree((_Rb_tree<const_slang::ast::ValueSymbol_*,_std::pair<const_slang::ast::ValueSymbol_*const,_slang::ConstantValue>,_std::_Select1st<std::pair<const_slang::ast::ValueSymbol_*const,_slang::ConstantValue>_>,_std::less<const_slang::ast::ValueSymbol_*>,_std::allocator<std::pair<const_slang::ast::ValueSymbol_*const,_slang::ConstantValue>_>_>
                   *)this_00);
      this_00 = this_00 + 1;
      lVar1 = lVar1 + -0x50;
    } while (lVar1 != 0);
  }
  if (this->data_ != (pointer)this->firstElement) {
    free(this->data_);
    return;
  }
  return;
}

Assistant:

void cleanup() {
        std::destroy(begin(), end());
        if (!isSmall())
            free(data_);
    }